

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::QuerySurfaceCase::checkNonPbufferAttributes
          (QuerySurfaceCase *this,EGLDisplay display,EGLSurface surface)

{
  ostringstream *this_00;
  ostringstream *this_01;
  uint value_00;
  int iVar1;
  Library *pLVar2;
  char *__s;
  long lVar3;
  bool bVar4;
  EGLint value;
  string name;
  int local_1fc;
  QuerySurfaceCase *local_1f8;
  TestLog *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  EGLSurface local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  local_1c8 = surface;
  pLVar2 = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  local_1f0 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
              )->m_log;
  local_1fc = -0x2a;
  this_00 = (ostringstream *)(local_1b0 + 8);
  lVar3 = 0;
  local_1f8 = this;
  do {
    value_00 = *(uint *)((long)checkNonPbufferAttributes::pbufferAttribs + lVar3);
    __s = eglu::getSurfaceAttribName(value_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,__s,(allocator<char> *)local_1b0);
    (*pLVar2->_vptr_Library[0x2b])(pLVar2,display,local_1c8,(ulong)value_00,&local_1fc);
    iVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
    if (iVar1 == 0x3000) {
      bVar4 = false;
      if (local_1fc != -0x2a) {
        local_1b0._0_8_ = local_1f0;
        this_01 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"    Fail, return value contents were modified when querying "
                   ,0x3c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,(char *)local_1e8,local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01," from a non-pbuffer surface.",0x1c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        tcu::TestContext::setTestResult
                  ((local_1f8->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Illegal modification of return value");
      }
    }
    else {
      local_1b0._0_8_ = local_1f0;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"    Fail, querying ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(char *)local_1e8,local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 " from a non-pbuffer surface should not result in an error, received ",0x44);
      local_1c0.m_getName = eglu::getErrorName;
      local_1c0.m_value = iVar1;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      bVar4 = true;
      tcu::TestContext::setTestResult
                ((local_1f8->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Illegal error condition");
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
  } while ((!bVar4) && (bVar4 = lVar3 != 0x10, lVar3 = lVar3 + 4, bVar4));
  return;
}

Assistant:

void QuerySurfaceCase::checkNonPbufferAttributes (EGLDisplay display, EGLSurface surface)
{
	const Library&	egl						= m_eglTestCtx.getLibrary();
	const EGLint	uninitializedMagicValue	= -42;
	tcu::TestLog&	log						= m_testCtx.getLog();
	EGLint			value					= uninitializedMagicValue;

	static const EGLint pbufferAttribs[] =
	{
		EGL_LARGEST_PBUFFER,
		EGL_TEXTURE_FORMAT,
		EGL_TEXTURE_TARGET,
		EGL_MIPMAP_TEXTURE,
		EGL_MIPMAP_LEVEL,
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pbufferAttribs); ndx++)
	{
		const EGLint		attribute	= pbufferAttribs[ndx];
		const std::string	name		= eglu::getSurfaceAttribName(pbufferAttribs[ndx]);

		egl.querySurface(display, surface, attribute, &value);

		{
			const EGLint	error	= egl.getError();

			if (error != EGL_SUCCESS)
			{
				log << TestLog::Message << "    Fail, querying " << name << " from a non-pbuffer surface should not result in an error, received "
					<< eglu::getErrorStr(error) << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Illegal error condition");
				break;
			}
		}

		// "For a window or pixmap surface, the contents of value are not modified."
		if (value != uninitializedMagicValue)
		{
			log << TestLog::Message << "    Fail, return value contents were modified when querying " << name << " from a non-pbuffer surface." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Illegal modification of return value");
		}
	}
}